

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow **ppIVar1;
  ImGuiContext *pIVar2;
  
  pIVar2 = GImGui;
  if (-2 < offset) {
    ppIVar1 = &GImGui->CurrentWindow;
    GImGui->FocusRequestNextWindow = *ppIVar1;
    pIVar2->FocusRequestNextCounterRegular = ((*ppIVar1)->DC).FocusCounterRegular + offset + 1;
    pIVar2->FocusRequestNextCounterTabStop = 0x7fffffff;
    return;
  }
  __assert_fail("offset >= -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O3/_deps/imgui-src/imgui.cpp"
                ,0x1a8c,"void ImGui::SetKeyboardFocusHere(int)");
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    g.FocusRequestNextWindow = window;
    g.FocusRequestNextCounterRegular = window->DC.FocusCounterRegular + 1 + offset;
    g.FocusRequestNextCounterTabStop = INT_MAX;
}